

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O0

int writeLong(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json)

{
  writeoutid wVar1;
  int iVar2;
  int local_38;
  ulong local_30;
  long longinfo;
  _Bool valid;
  _Bool use_json_local;
  per_transfer *ppStack_20;
  CURLcode per_result_local;
  per_transfer *per_local;
  writeoutvar *wovar_local;
  FILE *stream_local;
  
  longinfo._2_1_ = 0;
  local_30 = 0;
  longinfo._3_1_ = use_json;
  longinfo._4_4_ = per_result;
  ppStack_20 = per;
  per_local = (per_transfer *)wovar;
  wovar_local = (writeoutvar *)stream;
  if (wovar->ci == CURLINFO_NONE) {
    wVar1 = wovar->id;
    if (wVar1 == VAR_EXITCODE) {
      local_30 = (ulong)per_result;
      longinfo._2_1_ = 1;
    }
    else if (wVar1 == VAR_NUM_CERTS) {
      certinfo(per);
      if (ppStack_20->certinfo == (curl_certinfo *)0x0) {
        local_38 = 0;
      }
      else {
        local_38 = ppStack_20->certinfo->num_of_certs;
      }
      local_30 = (ulong)local_38;
      longinfo._2_1_ = 1;
    }
    else if (wVar1 == VAR_NUM_HEADERS) {
      local_30 = per->num_headers;
      longinfo._2_1_ = 1;
    }
    else if (wVar1 == VAR_NUM_RETRY) {
      local_30 = per->num_retries;
      longinfo._2_1_ = 1;
    }
    else if ((wVar1 == VAR_URLNUM) &&
            (longinfo._2_1_ = per->urlnum < 0x80000000, (bool)longinfo._2_1_)) {
      local_30 = (ulong)per->urlnum;
    }
  }
  else {
    iVar2 = curl_easy_getinfo(per->curl,wovar->ci,&local_30);
    if (iVar2 == 0) {
      longinfo._2_1_ = 1;
    }
  }
  if ((longinfo._2_1_ & 1) == 0) {
    if ((longinfo._3_1_ & 1) != 0) {
      curl_mfprintf(wovar_local,"\"%s\":null",per_local->next);
    }
  }
  else if ((longinfo._3_1_ & 1) == 0) {
    if ((*(int *)&per_local->prev == 0xf) || (*(int *)&per_local->prev == 0x10)) {
      curl_mfprintf(wovar_local,"%03ld",local_30);
    }
    else {
      curl_mfprintf(wovar_local,"%ld",local_30);
    }
  }
  else {
    curl_mfprintf(wovar_local,"\"%s\":%ld",per_local->next,local_30);
  }
  return 1;
}

Assistant:

static int writeLong(FILE *stream, const struct writeoutvar *wovar,
                     struct per_transfer *per, CURLcode per_result,
                     bool use_json)
{
  bool valid = false;
  long longinfo = 0;

  DEBUGASSERT(wovar->writefunc == writeLong);

  if(wovar->ci) {
    if(!curl_easy_getinfo(per->curl, wovar->ci, &longinfo))
      valid = true;
  }
  else {
    switch(wovar->id) {
    case VAR_NUM_RETRY:
      longinfo = per->num_retries;
      valid = true;
      break;
    case VAR_NUM_CERTS:
      certinfo(per);
      longinfo = per->certinfo ? per->certinfo->num_of_certs : 0;
      valid = true;
      break;
    case VAR_NUM_HEADERS:
      longinfo = per->num_headers;
      valid = true;
      break;
    case VAR_EXITCODE:
      longinfo = (long)per_result;
      valid = true;
      break;
    case VAR_URLNUM:
      if(per->urlnum <= INT_MAX) {
        longinfo = (long)per->urlnum;
        valid = true;
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  if(valid) {
    if(use_json)
      fprintf(stream, "\"%s\":%ld", wovar->name, longinfo);
    else {
      if(wovar->id == VAR_HTTP_CODE || wovar->id == VAR_HTTP_CODE_PROXY)
        fprintf(stream, "%03ld", longinfo);
      else
        fprintf(stream, "%ld", longinfo);
    }
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }

  return 1; /* return 1 if anything was written */
}